

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  int iVar1;
  undefined1 local_110 [8];
  stbi__context s;
  int *comp_local;
  int *y_local;
  int *x_local;
  void *user_local;
  stbi_io_callbacks *c_local;
  
  s.img_buffer_original_end = (stbi_uc *)comp;
  stbi__start_callbacks((stbi__context *)local_110,c,user);
  iVar1 = stbi__info_main((stbi__context *)local_110,x,y,(int *)s.img_buffer_original_end);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__info_main(&s,x,y,comp);
}